

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMarkAsAdvancedCommand.cxx
# Opt level: O1

bool __thiscall
cmMarkAsAdvancedCommand::InitialPass
          (cmMarkAsAdvancedCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  cmState *this_00;
  char *pcVar5;
  cmake *this_01;
  char *pcVar6;
  pointer pbVar7;
  ulong uVar8;
  string *key;
  uint uVar9;
  char *__end;
  string local_88;
  char *local_68;
  string local_60;
  char *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar7 == (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
LAB_0023fa1a:
    bVar2 = false;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)pbVar7);
    if ((iVar3 == 0) ||
       (iVar3 = std::__cxx11::string::compare
                          ((char *)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start), iVar3 == 0)) {
      iVar3 = std::__cxx11::string::compare
                        ((char *)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      local_68 = "1";
      if (iVar3 == 0) {
        local_68 = "0";
      }
      bVar1 = true;
      uVar9 = 1;
    }
    else {
      local_68 = "1";
      uVar9 = 0;
      bVar1 = false;
    }
    uVar8 = (ulong)uVar9;
    pbVar7 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5;
    bVar2 = uVar4 <= uVar8;
    if (uVar8 < uVar4) {
      local_40 = local_68 + 1;
      local_38 = args;
      do {
        uVar9 = uVar9 + 1;
        key = pbVar7 + uVar8;
        this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
        pcVar5 = cmState::GetCacheEntryValue(this_00,key);
        if (pcVar5 == (char *)0x0) {
          this_01 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
          cmake::AddCacheEntry(this_01,key,(char *)0x0,(char *)0x0,6);
          bVar1 = true;
        }
        pcVar5 = cmState::GetCacheEntryValue(this_00,key);
        if (pcVar5 == (char *)0x0) {
          cmSystemTools::Error("This should never happen...",(char *)0x0,(char *)0x0,(char *)0x0);
        }
        else {
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"ADVANCED","");
          pcVar6 = cmState::GetCacheEntryProperty(this_00,key,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if (pcVar6 == (char *)0x0 || bVar1) {
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"ADVANCED","");
            local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,local_68,local_40);
            cmState::SetCacheEntryProperty(this_00,key,&local_88,&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
          }
        }
        if (pcVar5 == (char *)0x0) goto LAB_0023fa1a;
        uVar8 = (ulong)uVar9;
        pbVar7 = (local_38->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar4 = (long)(local_38->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5;
        bVar2 = uVar4 <= uVar8;
      } while (uVar8 < uVar4);
    }
  }
  return bVar2;
}

Assistant:

bool cmMarkAsAdvancedCommand::InitialPass(std::vector<std::string> const& args,
                                          cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  unsigned int i = 0;
  const char* value = "1";
  bool overwrite = false;
  if (args[0] == "CLEAR" || args[0] == "FORCE") {
    overwrite = true;
    if (args[0] == "CLEAR") {
      value = "0";
    }
    i = 1;
  }
  for (; i < args.size(); ++i) {
    std::string const& variable = args[i];
    cmState* state = this->Makefile->GetState();
    if (!state->GetCacheEntryValue(variable)) {
      this->Makefile->GetCMakeInstance()->AddCacheEntry(
        variable, nullptr, nullptr, cmStateEnums::UNINITIALIZED);
      overwrite = true;
    }
    if (!state->GetCacheEntryValue(variable)) {
      cmSystemTools::Error("This should never happen...");
      return false;
    }
    if (!state->GetCacheEntryProperty(variable, "ADVANCED") || overwrite) {
      state->SetCacheEntryProperty(variable, "ADVANCED", value);
    }
  }
  return true;
}